

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_pubkey_save(secp256k1_pubkey *pubkey,secp256k1_ge *ge)

{
  secp256k1_ge *in_RDI;
  secp256k1_ge_storage *unaff_retaddr;
  secp256k1_ge_storage s;
  undefined1 local_50 [72];
  
  secp256k1_ge_to_storage(unaff_retaddr,in_RDI);
  memcpy(in_RDI,local_50,0x40);
  return;
}

Assistant:

static void secp256k1_pubkey_save(secp256k1_pubkey* pubkey, secp256k1_ge* ge) {
    secp256k1_ge_storage s;

    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(ge));
    secp256k1_ge_to_storage(&s, ge);
    memcpy(&pubkey->data[0], &s, 64);
}